

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void decode(string *path)

{
  uchar *puVar1;
  char *__filename;
  FILE *__stream;
  int local_b4;
  int local_b0;
  int k;
  int i;
  int pixelCounter;
  FILE *fp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [8];
  string newPath;
  string local_50 [32];
  uchar *local_30;
  uchar *encodedPixels;
  uchar *occurences;
  uint local_18;
  int maximum;
  int height;
  int width;
  string *path_local;
  
  maximum = 0;
  local_18 = 0;
  occurences._4_4_ = 0;
  _height = path;
  std::__cxx11::string::string(local_50,(string *)path);
  puVar1 = readEncoded((string *)local_50,&encodedPixels,&maximum,(int *)&local_18,
                       (int *)((long)&occurences + 4));
  std::__cxx11::string::~string(local_50);
  local_30 = puVar1;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&fp,(ulong)path);
  std::operator+(local_80,(char *)&fp);
  std::__cxx11::string::~string((string *)&fp);
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"wb");
  fprintf(__stream,"P6\n%d %d\n255\n",(ulong)(uint)maximum,(ulong)local_18);
  k = 0;
  local_b0 = 0;
  while (local_b0 < (int)(maximum * local_18)) {
    for (local_b4 = 0; local_b4 < (int)(uint)encodedPixels[k]; local_b4 = local_b4 + 1) {
      fwrite(local_30 + k * 3,1,3,__stream);
      local_b0 = local_b0 + 1;
    }
    k = k + 1;
  }
  fclose(__stream);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void decode(std::string path)
{
    int width = 0;		// width of the image
    int height = 0;		// heigt of the image
    int maximum = 0;	// maximum pixel value

    unsigned char* occurences;
    unsigned char* encodedPixels = readEncoded(path, &occurences, width, height, maximum);

    string newPath = path.substr(0, path.size()-4) + "_decoded.ppm";
    FILE *fp = fopen(newPath.c_str(), "wb");
    fprintf(fp, "P6\n%d %d\n255\n", width, height);
    int pixelCounter = 0;
    for (int i = 0; i < width*height; )
    {
        for (int k = 0; k < occurences[pixelCounter]; k++)
        {
            fwrite(&encodedPixels[pixelCounter*3], 1, 3, fp);
            i++;        // we wrote one pixel
        }
        pixelCounter++;
    }
    fclose(fp);
}